

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tok_ifdef_ifndef(tokcxdef *ctx,char *p,int len,int is_ifdef)

{
  int len_00;
  char *sym;
  tokdfdef *ptVar1;
  char mysym [39];
  
  len_00 = tok_scan_defsym(ctx,p,len);
  if (len_00 != 0) {
    sym = tok_casefold_defsym(ctx,mysym,p,len_00);
    ptVar1 = tok_find_define(ctx,sym,len_00);
    ctx->tokcxif[ctx->tokcxifcnt] = '\x02' - ((is_ifdef == 0) != (ptVar1 != (tokdfdef *)0x0));
    if (ctx->tokcxifcnt < 0x40) {
      ctx->tokcxifcnt = ctx->tokcxifcnt + 1;
      tok_update_if_stat(ctx);
    }
    else {
      errlogf(ctx->tokcxerr,"TADS",0x74);
    }
  }
  return;
}

Assistant:

static void tok_ifdef_ifndef(tokcxdef *ctx, char *p, int len, int is_ifdef)
{
    int   symlen;
    char *sym;
    int   stat;
    int   found;
    char  mysym[TOKNAMMAX];

    /* get the symbol */
    sym = p;
    if (!(symlen = tok_scan_defsym(ctx, p, len)))
        return;

    /* if we're folding case, convert the symbol to lower case */
    sym = tok_casefold_defsym(ctx, mysym, sym, symlen);

    /* see if we can find it in the table, and set the status accordingly */
    found = (tok_find_define(ctx, sym, symlen) != 0);

    /* invert the test if this is an ifndef */
    if (!is_ifdef) found = !found;

    /* set the #if status accordingly */
    if (found)
        stat = TOKIF_IF_YES;
    else
        stat = TOKIF_IF_NO;
    ctx->tokcxif[ctx->tokcxifcnt] = stat;

    /* allocate a new #if level (making sure we have room) */
    if (ctx->tokcxifcnt >= TOKIFNEST)
    {
        errlog(ctx->tokcxerr, ERR_MANYPIF);
        return;
    }
    ctx->tokcxifcnt++;

    /* update the current status */
    tok_update_if_stat(ctx);
}